

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gait_plan.c
# Opt level: O2

void Calc_GaitTrajPolyCoeffi_Trot(void)

{
  float *__ptr;
  float *__ptr_00;
  undefined8 uVar1;
  undefined8 uVar2;
  Matrix_t sMatrix;
  Matrix_t MVar3;
  
  SwingTime_Trot = (1.0 - sRobot_MotionPara.DutyRatio) * sRobot_MotionPara.Cycle;
  SupportingTime_Trot = sRobot_MotionPara.Cycle * sRobot_MotionPara.DutyRatio;
  sMatrix = Traj3_Mat(SwingTime_Trot);
  MVar3 = Inv4(sMatrix);
  uVar1 = MVar3._8_8_;
  __ptr = MVar3.pMatrix;
  MVar3 = Traj3_Para_Mat(sRobot_MotionPara.DutyRatio * -4.0 + 1.0,-4.0,1.0,-4.0);
  uVar2 = MVar3._8_8_;
  __ptr_00 = MVar3.pMatrix;
  if (((Coeff_X.pMatrix != (float *)0x0) && (Coeff_Y.pMatrix != (float *)0x0)) &&
     (Coeff_W.pMatrix != (float *)0x0)) {
    free(Coeff_X.pMatrix);
    free(Coeff_Y.pMatrix);
    free(Coeff_W.pMatrix);
  }
  Coeff_X = MatrixMultiply(2,__ptr,uVar1,__ptr_00,uVar2);
  Coeff_Y = MatrixMultiply(2,__ptr,uVar1,__ptr_00,uVar2);
  Coeff_W = MatrixMultiply(2,__ptr,uVar1,__ptr_00,uVar2);
  free(sMatrix.pMatrix);
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void Calc_GaitTrajPolyCoeffi_Trot(void)
{
	Matrix_t InverseMatrix, TrajectoryPlanningMatrix, TrajectoryPlanningParameterMatrix;

	SupportingTime_Trot = sRobot_MotionPara.Cycle * sRobot_MotionPara.DutyRatio;
	SwingTime_Trot = sRobot_MotionPara.Cycle * (1 - sRobot_MotionPara.DutyRatio);

	TrajectoryPlanningMatrix = Traj3_Mat(SwingTime_Trot);
	InverseMatrix = Inv4(TrajectoryPlanningMatrix);
	TrajectoryPlanningParameterMatrix = Traj3_Para_Mat(1 - 4 * sRobot_MotionPara.DutyRatio, -4, 1, -4);

	if (Coeff_X.pMatrix != NULL && Coeff_Y.pMatrix != NULL && Coeff_W.pMatrix != NULL)
	{
		free(Coeff_X.pMatrix);
		free(Coeff_Y.pMatrix);
		free(Coeff_W.pMatrix);
	}

	Coeff_X = MatrixMultiply(2, InverseMatrix, TrajectoryPlanningParameterMatrix);
	Coeff_Y = MatrixMultiply(2, InverseMatrix, TrajectoryPlanningParameterMatrix);
	Coeff_W = MatrixMultiply(2, InverseMatrix, TrajectoryPlanningParameterMatrix);

	free(TrajectoryPlanningMatrix.pMatrix);
	free(InverseMatrix.pMatrix);
	free(TrajectoryPlanningParameterMatrix.pMatrix);
}